

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuillotineBinPack.cpp
# Opt level: O1

int GuillotineBinPack::ScoreByHeuristic
              (int width,int height,Rect *freeRect,FreeRectChoiceHeuristic rectChoice)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  switch(rectChoice) {
  case RectBestAreaFit:
    return freeRect->height * freeRect->width - height * width;
  case RectBestShortSideFit:
    iVar2 = freeRect->width - width;
    iVar1 = -iVar2;
    if (0 < iVar2) {
      iVar1 = iVar2;
    }
    iVar3 = freeRect->height - height;
    iVar2 = -iVar3;
    if (0 < iVar3) {
      iVar2 = iVar3;
    }
    if (iVar1 < iVar2) {
      iVar2 = iVar1;
    }
    return iVar2;
  case RectBestLongSideFit:
    iVar2 = freeRect->width - width;
    iVar1 = -iVar2;
    if (0 < iVar2) {
      iVar1 = iVar2;
    }
    iVar3 = freeRect->height - height;
    iVar2 = -iVar3;
    if (0 < iVar3) {
      iVar2 = iVar3;
    }
    if (iVar2 < iVar1) {
      iVar2 = iVar1;
    }
    return iVar2;
  case RectWorstAreaFit:
    return height * width - freeRect->height * freeRect->width;
  case RectWorstShortSideFit:
    iVar2 = freeRect->width - width;
    iVar1 = -iVar2;
    if (0 < iVar2) {
      iVar1 = iVar2;
    }
    iVar3 = freeRect->height - height;
    iVar2 = -iVar3;
    if (0 < iVar3) {
      iVar2 = iVar3;
    }
    if (iVar1 < iVar2) {
      iVar2 = iVar1;
    }
    break;
  case RectWorstLongSideFit:
    iVar2 = freeRect->width - width;
    iVar1 = -iVar2;
    if (0 < iVar2) {
      iVar1 = iVar2;
    }
    iVar3 = freeRect->height - height;
    iVar2 = -iVar3;
    if (0 < iVar3) {
      iVar2 = iVar3;
    }
    if (iVar2 < iVar1) {
      iVar2 = iVar1;
    }
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/GuillotineBinPack.cpp"
                  ,0x185,
                  "static int GuillotineBinPack::ScoreByHeuristic(int, int, const Rect &, FreeRectChoiceHeuristic)"
                 );
  }
  return -iVar2;
}

Assistant:

int GuillotineBinPack::ScoreByHeuristic(int width, int height, const Rect &freeRect, FreeRectChoiceHeuristic rectChoice)
{
	switch(rectChoice)
	{
	case RectBestAreaFit: return ScoreBestAreaFit(width, height, freeRect);
	case RectBestShortSideFit: return ScoreBestShortSideFit(width, height, freeRect);
	case RectBestLongSideFit: return ScoreBestLongSideFit(width, height, freeRect);
	case RectWorstAreaFit: return ScoreWorstAreaFit(width, height, freeRect);
	case RectWorstShortSideFit: return ScoreWorstShortSideFit(width, height, freeRect);
	case RectWorstLongSideFit: return ScoreWorstLongSideFit(width, height, freeRect);
	default: assert(false); return INT_MAX;
	}
}